

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerManager.cpp
# Opt level: O3

int __thiscall
ztimer::TimerManager::RegisterAbsTimer(TimerManager *this,unsigned_long timerId,string *timePoint)

{
  int iVar1;
  time_point tVar2;
  long lVar3;
  iterator iVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  unsigned_long local_38;
  unsigned_long local_30;
  
  local_38 = timerId;
  tVar2 = Str2Time(this,timePoint);
  lVar3 = std::chrono::_V2::system_clock::now();
  iVar1 = 2;
  if (lVar3 <= (long)tVar2.__d.__r) {
    if (tVar2.__d.__r == 0) {
      iVar1 = 3;
    }
    else {
      iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx);
      if (iVar1 != 0) {
        std::__throw_system_error(iVar1);
      }
      iVar1 = 1;
      if (timerId != 0) {
        local_30 = timerId;
        iVar4 = std::
                _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(this->timerMap)._M_h,&local_30);
        if (iVar4.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_int>,_false>.
            _M_cur == (__node_type *)0x0) {
          pmVar5 = std::__detail::
                   _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&this->timerMap,&local_38);
          *pmVar5 = 0;
          pmVar6 = std::__detail::
                   _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&this->AbsTimerMap,&local_38);
          (pmVar6->__d).__r = (rep)tVar2.__d.__r;
          pmVar7 = std::__detail::
                   _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)(this->timeWheel).
                                   super__Vector_base<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>,_std::allocator<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start,&local_38);
          pmVar7->_M_elems[0] = 2;
          pmVar7->_M_elems[1] = 0;
          pmVar7->_M_elems[2] = 0;
          iVar1 = 0;
        }
      }
      pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
    }
  }
  return iVar1;
}

Assistant:

int TimerManager::RegisterAbsTimer(unsigned long timerId, const std::string& timePoint)
    {
        auto futureTime = Str2Time(timePoint);
        if (futureTime < Now()) {
            return ERR_TIME_POINT_LATE;
        }

        if (!TimePointValid(futureTime)) {
            return ERR_TIME_POINT_FMT;
        }
        std::lock_guard<std::mutex> lk(mtx);
        if (!TimerValid(timerId) || TimerExist(timerId)) {
            return ERR_TIMER_ID_INVALID_EXIST;
        }
        timerMap[timerId] = 0;
        AbsTimerMap[timerId] = futureTime;
        timeWheel[0][timerId] = {ABS_ONCE, 0, 0};
        return ERR_OK;
    }